

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_GLSL_RET(Context *ctx)

{
  ctx->indent = ctx->indent + -1;
  output_line(ctx,"}");
  if (ctx->output != (Buffer *)0x0) {
    if (ctx->isfail == 0) {
      buffer_append(ctx->output,ctx->endline,(long)ctx->endline_len);
    }
    set_output(ctx,&ctx->subroutines);
    return;
  }
  __assert_fail("ctx->output != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x1d3,"void output_blank_line(Context *)");
}

Assistant:

static void emit_GLSL_RET(Context *ctx)
{
    // thankfully, the MSDN specs say a RET _has_ to end a function...no
    //  early returns. So if you hit one, you know you can safely close
    //  a high-level function.
    ctx->indent--;
    output_line(ctx, "}");
    output_blank_line(ctx);
    set_output(ctx, &ctx->subroutines);  // !!! FIXME: is this for LABEL? Maybe set it there so we don't allocate unnecessarily.
}